

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeachCli.hpp
# Opt level: O2

void __thiscall peach::cli::PeachCli::~PeachCli(PeachCli *this)

{
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->scope_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&this->keywords_);
  interpreter::Interpreter::~Interpreter(&this->interpreter_);
  fsm::FsmCollection::~FsmCollection(&this->tokenizator_);
  return;
}

Assistant:

PeachCli()
        : interpreter_(std::vector<token::tokenCategory_t>{
                           token::tokenCategory::SEP_TAB,
                       },
                       {
                           {
                               [](peach::expression::PeachTuple args) {
                                   return !args[0];
                               },
                               "!",
                               token::tokenCategory::OPERATOR_UN,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   expression::VType res = 1;
                                   expression::VType deg = args[1];
                                   expression::VType x = args[0];
                                   while (deg)
                                   {
                                       if (!(deg & 1))
                                       {
                                           x *= x;
                                           deg >>= 1;
                                       }
                                       else
                                       {
                                           res *= x;
                                           --deg;
                                       }
                                   }
                                   return res;
                               },
                               "**",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] * args[1];
                               },
                               "*",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   if (args[1] == 0)
                                   {
                                       throw exception::ZeroDivisionError();
                                   }
                                   return args[0] / args[1];
                               },
                               "/",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] % args[1];
                               },
                               "%",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] + args[1];
                               },
                               "+",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] - args[1];
                               },
                               "-",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] == args[1];
                               },
                               "==",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] != args[1];
                               },
                               "!=",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] > args[1];
                               },
                               ">",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] >= args[1];
                               },
                               ">=",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] < args[1];
                               },
                               "<",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] <= args[1];
                               },
                               "<=",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] || args[1];
                               },
                               "|",
                               token::tokenCategory::OPERATOR_BI,
                           },
                           {
                               [](peach::expression::PeachTuple args) {
                                   return args[0] && args[1];
                               },
                               "&",
                               token::tokenCategory::OPERATOR_BI,
                           },
                       },
                       {
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left = right;
                               },
                               "=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left += right;
                               },
                               "+=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left -= right;
                               },
                               "-=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left *= right;
                               },
                               "*=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left /= right;
                               },
                               "/=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left %= right;
                               },
                               "%=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left &= right;
                               },
                               "&=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                           {
                               [](peach::expression::VType &left, peach::expression::VType right) {
                                   left |= right;
                               },
                               "|=",
                               token::tokenCategory::ASSIGNMENT,
                           },
                       }),
          keywords_({
              {"if", token::tokenCategory::COND_IF},
              {"else", token::tokenCategory::COND_ELSE},
              {"while", token::tokenCategory::LOOP_WHILE},
              {"let", token::tokenCategory::DECLARATION},
          })

    {
        using peach::token::tokenCategory;
        using peach::token::tokenCategory_t;
        using namespace peach::transition;
        tokenizator_
            .buildAppendFsm<peach::fsm::NameFinder>()                                     //
            .buildAppendFsm<peach::fsm::NumberFinder>(tokenCategory::VALUE_FLOATING, '.') //
            .buildAppendFsm<peach::fsm::NumberFinder>(tokenCategory::VALUE_INT)           //
            .buildAppendFsm<peach::fsm::OperatorFinder>(
                std::vector<std::pair<std::string, tokenCategory_t>>{
                    {"&=", tokenCategory::ASSIGNMENT},
                    {"&", tokenCategory::OPERATOR_BI},
                    {"|=", tokenCategory::ASSIGNMENT},
                    {"|", tokenCategory::OPERATOR_BI},
                    {"*=", tokenCategory::ASSIGNMENT},
                    {"**", tokenCategory::OPERATOR_BI},
                    {"*", tokenCategory::OPERATOR_BI},
                    {"/=", tokenCategory::ASSIGNMENT},
                    {"/", tokenCategory::OPERATOR_BI},
                    {"%=", tokenCategory::ASSIGNMENT},
                    {"%", tokenCategory::OPERATOR_BI},
                    {"+=", tokenCategory::ASSIGNMENT},
                    {"+", tokenCategory::OPERATOR_BI},
                    {"-=", tokenCategory::ASSIGNMENT},
                    {"-", tokenCategory::OPERATOR_BI},
                    {"==", tokenCategory::OPERATOR_BI},
                    {"=", tokenCategory::ASSIGNMENT},
                    {"!=", tokenCategory::OPERATOR_BI},
                    {"!", tokenCategory::OPERATOR_UN},
                    {">", tokenCategory::OPERATOR_BI},
                    {"<", tokenCategory::OPERATOR_BI},
                    {">=", tokenCategory::OPERATOR_BI},
                    {"<=", tokenCategory::OPERATOR_BI},
                }) //
            .buildAppendFsm<peach::fsm::SingleCharFinder>(
                std::vector<std::pair<char, tokenCategory_t>>{
                    {'\n', tokenCategory::SEP_ENDL},
                    {' ', tokenCategory::SEP_SPACE},
                    {'\t', tokenCategory::SEP_TAB},
                    {'(', tokenCategory::BRACKET_OPEN},
                    {')', tokenCategory::BRACKET_CLOSE},
                }) //
            ;
    }